

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void fio_listen_on_startup(void *pr_)

{
  uint uVar1;
  char *format;
  bool bVar2;
  
  fio_state_callback_remove(FIO_CALL_ON_SHUTDOWN,fio_listen_cleanup_task,pr_);
  fio_attach__internal(*(void **)((long)pr_ + 0x30),pr_);
  if (4 < FIO_LOG_LEVEL) {
    bVar2 = *(long *)((long)pr_ + 0x68) == 0;
    format = 
    "DEBUG (/workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/facil/lib/facil/fio.c:4514): (%d) started listening on port %s"
    ;
    if (bVar2) {
      format = 
      "DEBUG (/workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/facil/lib/facil/fio.c:4517): (%d) started listening on Unix Socket at %s"
      ;
    }
    uVar1 = getpid();
    FIO_LOG2STDERR(format,(ulong)uVar1,*(undefined8 *)((long)pr_ + (ulong)bVar2 * 8 + 0x58));
    return;
  }
  return;
}

Assistant:

static void fio_listen_on_startup(void *pr_) {
  fio_state_callback_remove(FIO_CALL_ON_SHUTDOWN, fio_listen_cleanup_task, pr_);
  fio_listen_protocol_s *pr = pr_;
  fio_attach(pr->uuid, &pr->pr);
  if (pr->port_len)
    FIO_LOG_DEBUG("(%d) started listening on port %s", (int)getpid(), pr->port);
  else
    FIO_LOG_DEBUG("(%d) started listening on Unix Socket at %s", (int)getpid(),
                  pr->addr);
}